

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O0

vector<long,_std::allocator<long>_> *
deqp::gles2::Performance::vectorLowestPercentage<long>
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,
          vector<long,_std::allocator<long>_> *v,float factor)

{
  size_type sVar1;
  iterator __first;
  iterator __last;
  float fVar2;
  float local_48;
  int targetSize;
  float factor_local;
  vector<long,_std::allocator<long>_> *v_local;
  vector<long,_std::allocator<long>_> *temp;
  
  sVar1 = std::vector<long,_std::allocator<long>_>::size(v);
  local_48 = (float)sVar1;
  fVar2 = ::deFloatCeil(factor * local_48);
  std::vector<long,_std::allocator<long>_>::vector(__return_storage_ptr__,v);
  __first = std::vector<long,_std::allocator<long>_>::begin(__return_storage_ptr__);
  __last = std::vector<long,_std::allocator<long>_>::end(__return_storage_ptr__);
  std::sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
            ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
             __first._M_current,
             (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)__last._M_current
            );
  while (sVar1 = std::vector<long,_std::allocator<long>_>::size(__return_storage_ptr__),
        (int)fVar2 < (int)sVar1) {
    std::vector<long,_std::allocator<long>_>::pop_back(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static vector<T> vectorLowestPercentage (const vector<T>& v, float factor)
{
	DE_ASSERT(0.0f < factor && factor <= 1.0f);

	int			targetSize	= (int)(deFloatCeil(factor*(float)v.size()));
	vector<T>	temp		= v;
	std::sort(temp.begin(), temp.end());

	while ((int)temp.size() > targetSize)
		temp.pop_back();

	return temp;
}